

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLAES.cpp
# Opt level: O0

EVP_CIPHER * __thiscall OSSLAES::getCipher(OSSLAES *this)

{
  long lVar1;
  undefined8 uVar2;
  EVP_CIPHER *pEVar3;
  long in_RDI;
  
  if (*(long *)(in_RDI + 8) != 0) {
    lVar1 = (**(code **)(**(long **)(in_RDI + 8) + 0x38))();
    if (((lVar1 == 0x80) || (lVar1 = (**(code **)(**(long **)(in_RDI + 8) + 0x38))(), lVar1 == 0xc0)
        ) || (lVar1 = (**(code **)(**(long **)(in_RDI + 8) + 0x38))(), lVar1 == 0x100)) {
      if (*(int *)(in_RDI + 0x10) == 1) {
        lVar1 = (**(code **)(**(long **)(in_RDI + 8) + 0x38))();
        if (lVar1 == 0x80) {
          pEVar3 = EVP_aes_128_cbc();
          return (EVP_CIPHER *)pEVar3;
        }
        if (lVar1 == 0xc0) {
          pEVar3 = EVP_aes_192_cbc();
          return (EVP_CIPHER *)pEVar3;
        }
        if (lVar1 == 0x100) {
          pEVar3 = EVP_aes_256_cbc();
          return (EVP_CIPHER *)pEVar3;
        }
      }
      else if (*(int *)(in_RDI + 0x10) == 4) {
        lVar1 = (**(code **)(**(long **)(in_RDI + 8) + 0x38))();
        if (lVar1 == 0x80) {
          pEVar3 = EVP_aes_128_ecb();
          return (EVP_CIPHER *)pEVar3;
        }
        if (lVar1 == 0xc0) {
          pEVar3 = EVP_aes_192_ecb();
          return (EVP_CIPHER *)pEVar3;
        }
        if (lVar1 == 0x100) {
          pEVar3 = EVP_aes_256_ecb();
          return (EVP_CIPHER *)pEVar3;
        }
      }
      else if (*(int *)(in_RDI + 0x10) == 3) {
        lVar1 = (**(code **)(**(long **)(in_RDI + 8) + 0x38))();
        if (lVar1 == 0x80) {
          pEVar3 = EVP_aes_128_ctr();
          return (EVP_CIPHER *)pEVar3;
        }
        if (lVar1 == 0xc0) {
          pEVar3 = EVP_aes_192_ctr();
          return (EVP_CIPHER *)pEVar3;
        }
        if (lVar1 == 0x100) {
          pEVar3 = EVP_aes_256_ctr();
          return (EVP_CIPHER *)pEVar3;
        }
      }
      else if (*(int *)(in_RDI + 0x10) == 5) {
        lVar1 = (**(code **)(**(long **)(in_RDI + 8) + 0x38))();
        if (lVar1 == 0x80) {
          pEVar3 = EVP_aes_128_gcm();
          return (EVP_CIPHER *)pEVar3;
        }
        if (lVar1 == 0xc0) {
          pEVar3 = EVP_aes_192_gcm();
          return (EVP_CIPHER *)pEVar3;
        }
        if (lVar1 == 0x100) {
          pEVar3 = EVP_aes_256_gcm();
          return (EVP_CIPHER *)pEVar3;
        }
      }
      softHSMLog(3,"getCipher",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLAES.cpp"
                 ,0x10a,"Invalid AES cipher mode %i",(ulong)*(uint *)(in_RDI + 0x10));
    }
    else {
      uVar2 = (**(code **)(**(long **)(in_RDI + 8) + 0x38))();
      softHSMLog(3,"getCipher",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLAES.cpp"
                 ,0xd3,"Invalid AES currentKey length (%d bits)",uVar2);
    }
  }
  return (EVP_CIPHER *)0x0;
}

Assistant:

const EVP_CIPHER* OSSLAES::getCipher() const
{
	if (currentKey == NULL) return NULL;

	// Check currentKey bit length; AES only supports 128, 192 or 256 bit keys
	if ((currentKey->getBitLen() != 128) &&
	    (currentKey->getBitLen() != 192) &&
            (currentKey->getBitLen() != 256))
	{
		ERROR_MSG("Invalid AES currentKey length (%d bits)", currentKey->getBitLen());

		return NULL;
	}

	// Determine the cipher mode
	if (currentCipherMode == SymMode::CBC)
	{
		switch(currentKey->getBitLen())
		{
			case 128:
				return EVP_aes_128_cbc();
			case 192:
				return EVP_aes_192_cbc();
			case 256:
				return EVP_aes_256_cbc();
		};
	}
	else if (currentCipherMode == SymMode::ECB)
	{
		switch(currentKey->getBitLen())
		{
			case 128:
				return EVP_aes_128_ecb();
			case 192:
				return EVP_aes_192_ecb();
			case 256:
				return EVP_aes_256_ecb();
		};
	}
	else if (currentCipherMode == SymMode::CTR)
	{
		switch(currentKey->getBitLen())
		{
			case 128:
				return EVP_aes_128_ctr();
			case 192:
				return EVP_aes_192_ctr();
			case 256:
				return EVP_aes_256_ctr();
		};
	}
	else if (currentCipherMode == SymMode::GCM)
	{
		switch(currentKey->getBitLen())
		{
			case 128:
				return EVP_aes_128_gcm();
			case 192:
				return EVP_aes_192_gcm();
			case 256:
				return EVP_aes_256_gcm();
		};
	}

	ERROR_MSG("Invalid AES cipher mode %i", currentCipherMode);

	return NULL;
}